

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O2

Maybe<kj::FsNode::Metadata> * __thiscall
kj::anon_unknown_8::DiskHandle::tryLstat
          (Maybe<kj::FsNode::Metadata> *__return_storage_ptr__,DiskHandle *this,PathPtr path)

{
  int iVar1;
  char *__file;
  Fault f;
  stat stats;
  Array<char> local_e8;
  PathPtr local_d0;
  stat local_c0;
  
  local_d0.parts.size_ = path.parts.size_;
  local_d0.parts.ptr = path.parts.ptr;
  do {
    iVar1 = (this->fd).fd;
    PathPtr::toString((String *)&local_e8,&local_d0,false);
    __file = "";
    if (local_e8.size_ != 0) {
      __file = local_e8.ptr;
    }
    iVar1 = fstatat(iVar1,__file,(stat *)&local_c0,0x100);
    Array<char>::~Array(&local_e8);
    if (-1 < iVar1) goto LAB_0031a8b5;
    iVar1 = _::Debug::getOsErrorNumber(false);
  } while (iVar1 == -1);
  if (iVar1 == 0) {
LAB_0031a8b5:
    statToMetadata(&(__return_storage_ptr__->ptr).field_1.value,&local_c0);
    (__return_storage_ptr__->ptr).isSet = true;
  }
  else if ((iVar1 == 0x14) || (iVar1 == 2)) {
    (__return_storage_ptr__->ptr).isSet = false;
  }
  else {
    _::Debug::Fault::Fault<int,kj::PathPtr&>
              ((Fault *)&local_e8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-unix.c++"
               ,0x2dc,iVar1,"faccessat(fd, path)","path",&local_d0);
    (__return_storage_ptr__->ptr).isSet = false;
    _::Debug::Fault::~Fault((Fault *)&local_e8);
  }
  return __return_storage_ptr__;
}

Assistant:

Maybe<FsNode::Metadata> tryLstat(PathPtr path) const {
    struct stat stats;
    KJ_SYSCALL_HANDLE_ERRORS(fstatat(fd, path.toString().cStr(), &stats, AT_SYMLINK_NOFOLLOW)) {
      case ENOENT:
      case ENOTDIR:
        return nullptr;
      default:
        KJ_FAIL_SYSCALL("faccessat(fd, path)", error, path) { return nullptr; }
    }
    return statToMetadata(stats);
  }